

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryMesh(AssbinExport *this,IOStream *container,aiMesh *mesh)

{
  uint *w;
  uint *w_00;
  aiVector3t<float> *paVar1;
  aiColor4t<float> *in;
  uint uVar2;
  uint n;
  long lVar3;
  uint uVar4;
  uint n_2;
  aiFace *paVar5;
  uint a;
  uint i;
  ulong uVar6;
  uint *puVar7;
  uint32_t hash;
  uint local_a4;
  uint *local_a0;
  uint32_t tmp;
  ulong local_90;
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x1237;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  chunk.container = container;
  Write<unsigned_int>(&chunk.super_IOStream,&mesh->mPrimitiveTypes);
  local_a0 = &mesh->mNumVertices;
  Write<unsigned_int>(&chunk.super_IOStream,local_a0);
  w = &mesh->mNumFaces;
  Write<unsigned_int>(&chunk.super_IOStream,w);
  w_00 = &mesh->mNumBones;
  Write<unsigned_int>(&chunk.super_IOStream,w_00);
  Write<unsigned_int>(&chunk.super_IOStream,&mesh->mMaterialIndex);
  local_a4 = (uint)(mesh->mVertices != (aiVector3D *)0x0);
  if (mesh->mNormals != (aiVector3D *)0x0) {
    local_a4 = local_a4 | 2;
  }
  if ((mesh->mTangents != (aiVector3D *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    local_a4 = local_a4 | 4;
  }
  for (lVar3 = 0; (lVar3 != 8 && (mesh->mTextureCoords[lVar3] != (aiVector3D *)0x0));
      lVar3 = lVar3 + 1) {
    local_a4 = local_a4 | 0x100 << ((byte)lVar3 & 0x1f);
  }
  for (lVar3 = 0; (lVar3 != 8 && (mesh->mColors[lVar3] != (aiColor4D *)0x0)); lVar3 = lVar3 + 1) {
    local_a4 = local_a4 | 0x10000 << ((byte)lVar3 & 0x1f);
  }
  Write<unsigned_int>(&chunk.super_IOStream,&local_a4);
  paVar1 = mesh->mVertices;
  if (paVar1 != (aiVector3t<float> *)0x0) {
    if (this->shortened == true) {
      WriteBounds<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
    else {
      WriteArray<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
  }
  paVar1 = mesh->mNormals;
  if (paVar1 != (aiVector3t<float> *)0x0) {
    if (this->shortened == true) {
      WriteBounds<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
    else {
      WriteArray<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
  }
  paVar1 = mesh->mTangents;
  if ((paVar1 != (aiVector3t<float> *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    if (this->shortened == true) {
      WriteBounds<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
      WriteBounds<aiVector3t<float>>(&chunk.super_IOStream,mesh->mBitangents,mesh->mNumVertices);
    }
    else {
      WriteArray<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
      WriteArray<aiVector3t<float>>(&chunk.super_IOStream,mesh->mBitangents,mesh->mNumVertices);
    }
  }
  for (lVar3 = 0; (lVar3 != 8 && (in = mesh->mColors[lVar3], in != (aiColor4t<float> *)0x0));
      lVar3 = lVar3 + 1) {
    if (this->shortened == true) {
      WriteBounds<aiColor4t<float>>(&chunk.super_IOStream,in,*local_a0);
    }
    else {
      WriteArray<aiColor4t<float>>(&chunk.super_IOStream,in,*local_a0);
    }
  }
  for (lVar3 = 0; (lVar3 != 0x20 && (*(long *)((long)mesh->mTextureCoords + lVar3 * 2) != 0));
      lVar3 = lVar3 + 4) {
    Write<unsigned_int>(&chunk.super_IOStream,(uint *)((long)mesh->mNumUVComponents + lVar3));
    paVar1 = *(aiVector3t<float> **)((long)mesh->mTextureCoords + lVar3 * 2);
    if (this->shortened == true) {
      WriteBounds<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
    else {
      WriteArray<aiVector3t<float>>(&chunk.super_IOStream,paVar1,*local_a0);
    }
  }
  if (this->shortened == false) {
    uVar6 = 0;
    while (uVar6 < *w) {
      paVar5 = mesh->mFaces;
      hash = CONCAT22(hash._2_2_,(short)paVar5[uVar6].mNumIndices);
      local_90 = uVar6;
      (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&hash,2,1);
      paVar5 = paVar5 + uVar6;
      lVar3 = 0;
      for (uVar6 = 0; uVar6 < paVar5->mNumIndices; uVar6 = uVar6 + 1) {
        if (*local_a0 < 0x10000) {
          hash = CONCAT22(hash._2_2_,*(undefined2 *)((long)paVar5->mIndices + lVar3));
          (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&hash,2,1);
        }
        else {
          Write<unsigned_int>(&chunk.super_IOStream,(uint *)((long)paVar5->mIndices + lVar3));
        }
        lVar3 = lVar3 + 4;
      }
      uVar6 = local_90 + 1;
    }
  }
  else {
    uVar2 = 0;
    while( true ) {
      uVar4 = *w - uVar2;
      if (0x1ff < uVar4) {
        uVar4 = 0x200;
      }
      if (*w == uVar2) break;
      hash = 0;
      local_90 = CONCAT44(local_90._4_4_,uVar4);
      local_a0 = (uint *)(ulong)uVar4;
      for (puVar7 = (uint *)0x0; puVar7 != local_a0; puVar7 = (uint *)((long)puVar7 + 1)) {
        uVar4 = (int)puVar7 + uVar2;
        paVar5 = mesh->mFaces + uVar4;
        tmp = mesh->mFaces[uVar4].mNumIndices;
        hash = SuperFastHash((char *)&tmp,4,hash);
        for (uVar6 = 0; uVar6 < paVar5->mNumIndices; uVar6 = uVar6 + 1) {
          tmp = paVar5->mIndices[uVar6];
          hash = SuperFastHash((char *)&tmp,4,hash);
        }
      }
      Write<unsigned_int>(&chunk.super_IOStream,&hash);
      uVar2 = (int)local_90 + uVar2;
    }
  }
  uVar2 = *w_00;
  if (uVar2 != 0) {
    for (uVar6 = 0; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      WriteBinaryBone(this,&chunk.super_IOStream,mesh->mBones[uVar6]);
      uVar2 = *w_00;
    }
  }
  AssbinChunkWriter::~AssbinChunkWriter(&chunk);
  return;
}

Assistant:

void WriteBinaryMesh(IOStream * container, const aiMesh* mesh)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIMESH );

        Write<unsigned int>(&chunk,mesh->mPrimitiveTypes);
        Write<unsigned int>(&chunk,mesh->mNumVertices);
        Write<unsigned int>(&chunk,mesh->mNumFaces);
        Write<unsigned int>(&chunk,mesh->mNumBones);
        Write<unsigned int>(&chunk,mesh->mMaterialIndex);

        // first of all, write bits for all existent vertex components
        unsigned int c = 0;
        if (mesh->mVertices) {
            c |= ASSBIN_MESH_HAS_POSITIONS;
        }
        if (mesh->mNormals) {
            c |= ASSBIN_MESH_HAS_NORMALS;
        }
        if (mesh->mTangents && mesh->mBitangents) {
            c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_TEXCOORD(n);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_COLOR(n);
        }
        Write<unsigned int>(&chunk,c);

        aiVector3D minVec, maxVec;
        if (mesh->mVertices) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mVertices,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mVertices,mesh->mNumVertices);
        }
        if (mesh->mNormals) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mNormals,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mNormals,mesh->mNumVertices);
        }
        if (mesh->mTangents && mesh->mBitangents) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteBounds(&chunk,mesh->mBitangents,mesh->mNumVertices);
            } // else write as usual
            else {
                WriteArray<aiVector3D>(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteArray<aiVector3D>(&chunk,mesh->mBitangents,mesh->mNumVertices);
            }
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n])
                break;

            if (shortened) {
                WriteBounds(&chunk,mesh->mColors[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiColor4D>(&chunk,mesh->mColors[n],mesh->mNumVertices);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n])
                break;

            // write number of UV components
            Write<unsigned int>(&chunk,mesh->mNumUVComponents[n]);

            if (shortened) {
                WriteBounds(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
        }

        // write faces. There are no floating-point calculations involved
        // in these, so we can write a simple hash over the face data
        // to the dump file. We generate a single 32 Bit hash for 512 faces
        // using Assimp's standard hashing function.
        if (shortened) {
            unsigned int processed = 0;
            for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

                uint32_t hash = 0;
                for (unsigned int a = 0; a < job;++a) {

                    const aiFace& f = mesh->mFaces[processed+a];
                    uint32_t tmp = f.mNumIndices;
                    hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
                        tmp = static_cast<uint32_t>( f.mIndices[i] );
                        hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    }
                }
                Write<unsigned int>(&chunk,hash);
            }
        }
        else // else write as usual
        {
            // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
            for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
                const aiFace& f = mesh->mFaces[i];

                static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
                Write<uint16_t>(&chunk,f.mNumIndices);

                for (unsigned int a = 0; a < f.mNumIndices;++a) {
                    if (mesh->mNumVertices < (1u<<16)) {
                        Write<uint16_t>(&chunk,f.mIndices[a]);
                    }
                    else Write<unsigned int>(&chunk,f.mIndices[a]);
                }
            }
        }

        // write bones
        if (mesh->mNumBones) {
            for (unsigned int a = 0; a < mesh->mNumBones;++a) {
                const aiBone* b = mesh->mBones[a];
                WriteBinaryBone(&chunk,b);
            }
        }
    }